

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void pextrd_(PDISASM pMyDisasm)

{
  char *pcVar1;
  UInt8 UVar2;
  Int32 IVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  
  if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
    if ((pMyDisasm->Prefix).OperandSize != '\x01') goto LAB_0012e516;
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    (pMyDisasm->Instruction).Category = 0x80027;
    pcVar1 = (pMyDisasm->Instruction).Mnemonic;
    if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
      builtin_strncpy(pcVar1,"pextrq",7);
      (pMyDisasm->Reserved_).OperandSize = 0x40;
      IVar3 = 4;
    }
    else {
      builtin_strncpy(pcVar1,"pextrd",7);
      IVar3 = 3;
    }
    (pMyDisasm->Reserved_).MemDecoration = IVar3;
    goto LAB_0012e575;
  }
  if ((pMyDisasm->Reserved_).VEX.pp != '\x01') {
LAB_0012e516:
    failDecode(pMyDisasm);
    return;
  }
  verifyVEXvvvv(pMyDisasm);
  if ((pMyDisasm->Reserved_).VEX.L != '\0') {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  UVar2 = (pMyDisasm->Reserved_).EVEX.state;
  if (UVar2 == '\x01') {
    if ((pMyDisasm->Reserved_).EVEX.W != '\x01') goto LAB_0012e4b7;
LAB_0012e528:
    uVar5 = 0x400000040;
    uVar4 = 0x71727478657076;
  }
  else {
    if ((pMyDisasm->Reserved_).REX.W_ == '\x01') goto LAB_0012e528;
LAB_0012e4b7:
    uVar5 = 0x300000020;
    uVar4 = 0x64727478657076;
  }
  *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar4;
  (pMyDisasm->Reserved_).OperandSize = (int)uVar5;
  (pMyDisasm->Reserved_).MemDecoration = (int)((ulong)uVar5 >> 0x20);
  IVar3 = 0x110027;
  if (UVar2 == '\x01') {
    (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
    IVar3 = 0x140027;
  }
  (pMyDisasm->Instruction).Category = IVar3;
LAB_0012e575:
  decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).Register_ = 4;
  decodeRegOpcode(&pMyDisasm->Operand2,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ pextrd_(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      verifyVEXvvvv(pMyDisasm);
      if (GV.VEX.L != 0) GV.ERROR_OPCODE = UD_;
      if
        (((GV.EVEX.state != InUsePrefix) && (GV.REX.W_ == 1)) ||
        ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 1)))
       {
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpextrq");
         #endif
         GV.MemDecoration = Arg1qword;
         GV.OperandSize = 64;
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpextrd");
        #endif
        GV.MemDecoration = Arg1dword;
        GV.OperandSize = 32;
      }
      if (GV.EVEX.state == InUsePrefix) {
        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION+INSERTION_EXTRACTION;
        GV.EVEX.tupletype = TUPLE1_SCALAR;
      }
      else {
        pMyDisasm->Instruction.Category = AVX_INSTRUCTION+INSERTION_EXTRACTION;
      }
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = SSE_REG;
      decodeRegOpcode(&pMyDisasm->Operand2, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
      getImmediat8(&pMyDisasm->Operand3, pMyDisasm);

    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    /* ========== 0x66 */
    if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
      GV.OperandSize = GV.OriginalOperandSize;
      pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
      GV.MemDecoration = Arg2_m128_xmm;
      pMyDisasm->Instruction.Category = SSE41_INSTRUCTION+INSERTION_EXTRACTION;
      if (GV.REX.W_ == 0x1) {
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pextrq");
        #endif
        GV.MemDecoration = Arg1qword;
        GV.OperandSize = 64;
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pextrd");
        #endif
        GV.MemDecoration = Arg1dword;
      }
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = SSE_REG;
      decodeRegOpcode(&pMyDisasm->Operand2, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
      getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
}